

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsConstant(Expr *p)

{
  uint uVar1;
  Walker local_38;
  
  local_38.u.pNC = (NameContext *)0x0;
  local_38.pParse = (Parse *)0x0;
  local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_38.walkerDepth = 0;
  local_38.eCode = '\x01';
  local_38._37_3_ = 0;
  local_38.xExprCallback = exprNodeIsConstant;
  local_38.xSelectCallback = selectNodeIsConstant;
  if (p == (Expr *)0x0) {
    uVar1 = 1;
  }
  else {
    walkExpr(&local_38,p);
    uVar1 = (uint)local_38.eCode;
  }
  return uVar1;
}

Assistant:

static int exprIsConst(Expr *p, int initFlag, int iCur){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.eCode = initFlag;
  w.xExprCallback = exprNodeIsConstant;
  w.xSelectCallback = selectNodeIsConstant;
  w.u.iCur = iCur;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}